

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<tinyusdz::value::matrix4d>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *attr,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Path *v;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pprint *this;
  pprint *ppVar6;
  pointer pPVar7;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar8;
  byte bVar9;
  char *pcVar10;
  double *pdVar11;
  string *psVar12;
  byte bVar13;
  byte bVar14;
  matrix4d a;
  stringstream ss;
  uint32_t local_31c;
  string local_318;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  string *local_298;
  string *local_290;
  byte local_288;
  double local_280 [16];
  byte local_200;
  char local_1ff;
  TypedTimeSamples<tinyusdz::value::matrix4d> local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pprint *)CONCAT44(in_register_0000000c,indent);
  bVar14 = 0;
  ppVar6 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar4 = (attr->_attrib).has_value_;
  local_290 = __return_storage_ptr__;
  if (bVar4 == false) {
    pPVar7 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar7 == (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      if ((attr->_value_empty == false) && ((attr->_blocked & 1U) == 0)) goto LAB_00312ebd;
      bVar9 = (attr->_blocked ^ 1U) & attr->_value_empty;
      bVar2 = 0;
      local_288 = bVar4;
    }
    else {
      bVar2 = 1;
      bVar9 = 0;
      local_288 = bVar4;
    }
  }
  else {
    local_288 = bVar4;
    memcpy(local_280,&(attr->_attrib).contained,0x82);
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
    ::vector(&local_1f8._samples,
             (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
              *)((long)&(attr->_attrib).contained + 0x88));
    local_1f8._dirty = *(bool *)((long)&(attr->_attrib).contained + 0xa0);
    pPVar7 = (pointer)CONCAT71((int7)((ulong)ppVar6 >> 8),local_1f8._dirty);
    bVar2 = 0;
    bVar9 = 0;
  }
  bVar13 = local_200;
  indent_00 = (uint32_t)pPVar7;
  if ((local_288 & 1) == 0) {
    bVar13 = 0;
    local_31c = 0;
  }
  else {
    if (((ulong)pPVar7 & 1) != 0) {
      TypedTimeSamples<tinyusdz::value::matrix4d>::update(&local_1f8);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_1f8._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_1f8._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_1f8._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_31c = indent_00;
  }
  if ((((local_288 & 1) == 0) || (local_1ff != '\0')) || (local_200 != 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = local_1f8._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1f8._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar3 = AttrMetas::authored(&attr->_metas);
  if (((bVar3) || (!(bool)(bVar2 | bVar4))) ||
     (n_01 = n, ((bVar9 | attr->_blocked | bVar13) & 1) != 0)) {
    pprint::Indent_abi_cxx11_(&local_318,this,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    paVar1 = &local_318.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    local_318.field_2._M_allocated_capacity = 0x643478697274616d;
    local_318._M_string_length = 8;
    local_318.field_2._8_8_ = local_318.field_2._8_8_ & 0xffffffffffffff00;
    local_318._M_dataplus._M_p = (pointer)paVar1;
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if (attr->_blocked == true) {
      pcVar10 = " = None";
      lVar8 = 7;
LAB_00312b28:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar10,lVar8);
    }
    else if (bVar13 != 0) {
      local_318._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      local_318._M_string_length = 0;
      local_318.field_2._M_allocated_capacity = 0;
      local_318.field_2._8_8_ = 0;
      uStack_2f8 = 0;
      local_2f0 = 0x3ff0000000000000;
      local_2e8 = 0;
      uStack_2e0 = 0;
      local_2d8 = 0;
      uStack_2d0 = 0;
      local_2c8 = 0x3ff0000000000000;
      local_2c0 = 0;
      uStack_2b8 = 0;
      local_2b0 = 0;
      uStack_2a8 = 0;
      local_2a0 = 0x3ff0000000000000;
      if (local_288 == 0) goto LAB_00312f1c;
      if ((local_1ff != '\0') || (local_200 != 1)) {
        pcVar10 = " = [InternalError]";
        lVar8 = 0x12;
        goto LAB_00312b28;
      }
      pdVar11 = local_280;
      psVar12 = &local_318;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar12->_M_dataplus)._M_p = (pointer)*pdVar11;
        pdVar11 = pdVar11 + (ulong)bVar14 * -2 + 1;
        psVar12 = (string *)((long)psVar12 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      indent_00 = (uint32_t)lVar8;
      ::std::operator<<(local_1a8,(matrix4d *)&local_318);
    }
    bVar4 = AttrMetas::authored(&attr->_metas);
    if (bVar4) {
      local_298 = name;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_318,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      name = local_298;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != paVar1) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        name = local_298;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_31c != '\0') {
    pprint::Indent_abi_cxx11_(&local_318,this,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    paVar1 = &local_318.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    local_318.field_2._M_allocated_capacity = 0x643478697274616d;
    local_318._M_string_length = 8;
    local_318.field_2._8_8_ = local_318.field_2._8_8_ & 0xffffffffffffff00;
    local_318._M_dataplus._M_p = (pointer)paVar1;
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_288 == 0) {
LAB_00312f1c:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::value() const [T = tinyusdz::Animatable<tinyusdz::value::matrix4d>]"
                   );
    }
    print_typed_timesamples<tinyusdz::value::matrix4d>(&local_318,&local_1f8,indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_318,this,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    paVar1 = &local_318.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    local_318.field_2._M_allocated_capacity = 0x643478697274616d;
    local_318._M_string_length = 8;
    local_318.field_2._8_8_ = local_318.field_2._8_8_ & 0xffffffffffffff00;
    local_318._M_dataplus._M_p = (pointer)paVar1;
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar8 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar8 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar8 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if ((local_288 == 1) &&
     (local_1f8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_1f8._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00312ebd:
  psVar12 = local_290;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar12;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}